

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

int CVode(void *cvode_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  N_Vector *Y;
  int *piVar1;
  uint uVar2;
  CVodeProjMem pCVar3;
  N_Vector p_Var4;
  CVodeMem pCVar5;
  CVodeMem pCVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  realtype *prVar16;
  double *pdVar17;
  void *pvVar18;
  long lVar19;
  double *pdVar20;
  CVodeMem pCVar21;
  realtype *prVar22;
  N_Vector p_Var23;
  SUNNonlinearSolver NLS;
  char *pcVar24;
  long lVar25;
  uint iend;
  bool bVar26;
  bool bVar27;
  realtype rVar28;
  undefined1 auVar29 [16];
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  realtype rVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  double adStack_768 [46];
  double adStack_5f8 [55];
  undefined8 uStack_440;
  CVodeMem local_430;
  double local_428;
  ulong uStack_420;
  int local_40c;
  realtype local_408;
  undefined8 local_400;
  realtype *local_3f8;
  N_Vector local_3f0;
  double local_3e8;
  ulong uStack_3e0;
  realtype *local_3d8;
  undefined8 uStack_3d0;
  double local_3c8;
  double dStack_3c0;
  int local_3b4;
  ulong local_3b0;
  ulong local_3a8;
  realtype *local_3a0;
  realtype *local_398;
  ulong uStack_390;
  int npf;
  long local_380;
  double local_378;
  ulong uStack_370;
  realtype *local_360;
  realtype *local_358;
  realtype *local_350;
  realtype ssmax [4];
  long nni_inc;
  double local_320 [4];
  double local_300 [4];
  double local_2e0 [4];
  undefined8 local_2c0 [4];
  double local_2a0 [4];
  double local_280 [3];
  realtype rav [4];
  realtype sigsq [4];
  realtype qkr [4];
  long local_208 [5];
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double adStack_1c0 [15];
  realtype vrat [5];
  realtype sqmx [4];
  realtype rrc [4];
  realtype smax [4];
  realtype qjk [4] [4];
  
  if (cvode_mem == (void *)0x0) {
    pcVar13 = "CVode";
    pcVar24 = "cvode_mem = NULL illegal.";
    iVar8 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    goto LAB_004ca416;
  }
  if (*(int *)((long)cvode_mem + 0x464) == 0) {
    pcVar13 = "CVode";
    pcVar24 = "Attempt to call before CVodeInit.";
    iVar8 = -0x17;
    goto LAB_004ca416;
  }
  *(N_Vector *)((long)cvode_mem + 0xd0) = yout;
  if (yout == (N_Vector)0x0) {
    pcVar13 = "CVode";
    pcVar24 = "yout = NULL illegal.";
  }
  else if (tret == (realtype *)0x0) {
    pcVar13 = "CVode";
    pcVar24 = "tret = NULL illegal.";
  }
  else {
    uVar15 = (ulong)(uint)itask;
    if (itask - 3U < 0xfffffffe) {
      pcVar13 = "CVode";
      pcVar24 = "Illegal value for itask.";
    }
    else {
      if (itask == 1) {
        *(realtype *)((long)cvode_mem + 0x5c0) = tout;
      }
      *(int *)((long)cvode_mem + 0x5d0) = itask;
      lVar14 = *(long *)((long)cvode_mem + 0x358);
      local_430 = (CVodeMem)cvode_mem;
      local_408 = tout;
      if (lVar14 != 0) {
LAB_004ca465:
        cvode_mem = local_430;
        if (lVar14 < 1) goto LAB_004cab49;
        dVar30 = local_430->cv_tn;
        dVar33 = (ABS(local_430->cv_h) + ABS(dVar30)) * local_430->cv_uround * 100.0;
        iVar8 = (int)uVar15;
        if (0 < local_430->cv_nrtfn) {
          iVar9 = local_430->cv_irfnd;
          uVar10 = 0;
          if (iVar9 != 0) {
            uStack_420 = 0;
            uStack_440 = 0x4ca4e4;
            local_428 = dVar33;
            CVodeGetDky(local_430,local_430->cv_tlo,0,local_430->cv_y);
            uStack_440 = 0x4ca504;
            iVar7 = (*((CVodeMem)cvode_mem)->cv_gfun)
                              (((CVodeMem)cvode_mem)->cv_tlo,((CVodeMem)cvode_mem)->cv_y,
                               ((CVodeMem)cvode_mem)->cv_glo,((CVodeMem)cvode_mem)->cv_user_data);
            pCVar5 = local_430;
            ((CVodeMem)cvode_mem)->cv_nge = ((CVodeMem)cvode_mem)->cv_nge + 1;
            if (iVar7 != 0) {
LAB_004ca513:
              pcVar13 = "cvRcheck2";
              pcVar24 = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
              iVar8 = -0xc;
              goto LAB_004caa59;
            }
            for (lVar14 = 0; uVar10 = (ulong)((CVodeMem)cvode_mem)->cv_nrtfn, lVar14 < (long)uVar10;
                lVar14 = lVar14 + 1) {
              ((CVodeMem)cvode_mem)->cv_iroots[lVar14] = 0;
            }
            bVar27 = false;
            for (lVar14 = 0; lVar14 < (int)uVar10; lVar14 = lVar14 + 1) {
              if (((local_430->cv_gactive[lVar14] != 0) && (local_430->cv_glo[lVar14] == 0.0)) &&
                 (!NAN(local_430->cv_glo[lVar14]))) {
                local_430->cv_iroots[lVar14] = 1;
                uVar10 = (ulong)(uint)local_430->cv_nrtfn;
                bVar27 = true;
              }
            }
            dVar30 = local_430->cv_tn;
            dVar33 = local_428;
            uVar10 = uStack_420;
            if (bVar27) {
              dVar33 = local_430->cv_h;
              dVar37 = (ABS(dVar33) + ABS(dVar30)) * local_430->cv_uround * 100.0;
              local_430->cv_ttol = dVar37;
              dVar37 = (double)(~-(ulong)(0.0 < dVar33) & (ulong)-dVar37 |
                               (ulong)dVar37 & -(ulong)(0.0 < dVar33));
              local_3e8 = local_430->cv_tlo + dVar37;
              if (0.0 <= (local_3e8 - dVar30) * dVar33) {
                uStack_440 = 0x4ca80b;
                N_VLinearSum(1.0,local_430->cv_y,dVar37 / dVar33,local_430->cv_zn[1],local_430->cv_y
                            );
              }
              else {
                uStack_440 = 0x4ca78a;
                CVodeGetDky(local_430,local_3e8,0,local_430->cv_y);
              }
              uStack_440 = 0x4ca829;
              iVar7 = (*pCVar5->cv_gfun)(local_3e8,pCVar5->cv_y,pCVar5->cv_ghi,pCVar5->cv_user_data)
              ;
              pCVar5->cv_nge = pCVar5->cv_nge + 1;
              cvode_mem = pCVar5;
              if (iVar7 != 0) goto LAB_004ca513;
              bVar27 = false;
              for (lVar14 = 0; lVar14 < local_430->cv_nrtfn; lVar14 = lVar14 + 1) {
                if (local_430->cv_gactive[lVar14] != 0) {
                  dVar30 = local_430->cv_ghi[lVar14];
                  iVar7 = local_430->cv_iroots[lVar14];
                  if ((dVar30 != 0.0) || (NAN(dVar30))) {
                    if (iVar7 == 1) {
                      local_430->cv_glo[lVar14] = dVar30;
                    }
                  }
                  else {
                    if (iVar7 == 1) {
                      pcVar13 = "cvRcheck2";
                      pcVar24 = "Root found at and very near t = %lg.";
                      iVar8 = -0x16;
                      cvode_mem = local_430;
                      goto LAB_004caa59;
                    }
                    local_430->cv_iroots[lVar14] = 1;
                    bVar27 = true;
                  }
                }
              }
              if (bVar27) goto LAB_004ccc5c;
              dVar30 = local_430->cv_tn;
              dVar33 = local_428;
              uVar10 = uStack_420;
            }
          }
          if (dVar33 < ABS(dVar30 - local_430->cv_tretlast)) {
            uStack_440 = 0x4ca983;
            local_428 = dVar33;
            uStack_420 = uVar10;
            iVar7 = cvRcheck3(local_430);
            if (iVar7 == -0xc) {
              pcVar13 = "cvRcheck3";
              goto LAB_004ccc95;
            }
            if (iVar7 == 1) {
              local_430->cv_irfnd = 1;
LAB_004ccc5c:
              rVar28 = local_430->cv_tlo;
              *tret = rVar28;
              local_430->cv_tretlast = rVar28;
              return 2;
            }
            dVar33 = local_428;
            if ((iVar7 == 0) && (local_430->cv_irfnd = 0, iVar8 == 2 && iVar9 == 1)) {
              rVar28 = local_430->cv_tn;
              *tret = rVar28;
              local_430->cv_tretlast = rVar28;
              p_Var23 = local_430->cv_zn[0];
              goto LAB_004caaa3;
            }
          }
        }
        cvode_mem = local_430;
        if (iVar8 == 1) {
          if (0.0 <= (local_430->cv_tn - local_408) * local_430->cv_h) {
            *tret = local_408;
            local_430->cv_tretlast = local_408;
            uStack_440 = 0x4caa2c;
            iVar8 = CVodeGetDky(local_430,local_408,0,yout);
            if (iVar8 == 0) {
              return 0;
            }
            pcVar13 = "CVode";
            pcVar24 = 
            "Trouble interpolating at tout = %lg. tout too far back in direction of integration";
            iVar8 = -0x16;
LAB_004caa59:
            uStack_440 = 0x4caa60;
            cvProcessError((CVodeMem)cvode_mem,iVar8,"CVODE",pcVar13,pcVar24);
            return iVar8;
          }
        }
        else if ((iVar8 == 2) &&
                (dVar30 = local_430->cv_tn, dVar33 < ABS(dVar30 - local_430->cv_tretlast))) {
          *tret = dVar30;
          local_430->cv_tretlast = dVar30;
          p_Var23 = local_430->cv_zn[0];
LAB_004caaa3:
          uStack_440 = 0x4caab3;
          N_VScale(1.0,p_Var23,yout);
          return 0;
        }
        if (local_430->cv_tstopset != 0) {
          dVar30 = local_430->cv_tstop;
          dVar37 = local_430->cv_tn;
          if (ABS(dVar37 - dVar30) <= dVar33) {
            uStack_440 = 0x4ccbe3;
            iVar8 = CVodeGetDky(local_430,dVar30,0,yout);
            rVar28 = ((CVodeMem)cvode_mem)->cv_tstop;
            if (iVar8 == 0) {
              *tret = rVar28;
LAB_004ccc3a:
              ((CVodeMem)cvode_mem)->cv_tretlast = rVar28;
              ((CVodeMem)cvode_mem)->cv_tstopset = 0;
              return 1;
            }
LAB_004ccbf7:
            uStack_440 = 0x4ccc1d;
            cvProcessError((CVodeMem)cvode_mem,-0x16,"CVODE","CVode",
                           "The value tstop = %lg is behind current t = %lg in the direction of integration."
                          );
            return -0x16;
          }
          if (0.0 < ((local_430->cv_hprime + dVar37) - dVar30) * local_430->cv_h) {
            dVar30 = (local_430->cv_uround * -4.0 + 1.0) * (dVar30 - dVar37);
            local_430->cv_hprime = dVar30;
            local_430->cv_eta = dVar30 / local_430->cv_h;
          }
        }
LAB_004cab49:
        pCVar5 = local_430;
        Y = local_430->cv_zn;
        local_3a0 = local_430->cv_l;
        prVar16 = local_430->proj_p;
        local_350 = local_430->cv_l + 2;
        local_358 = local_430->cv_ssdat[5] + 1;
        local_360 = local_430->cv_ssdat[1] + 1;
        local_380 = 0;
        cvode_mem = local_430;
        local_3f8 = tret;
        local_3f0 = yout;
        local_3b0 = uVar15;
LAB_004cabae:
        ((CVodeMem)cvode_mem)->cv_next_h = ((CVodeMem)cvode_mem)->cv_h;
        ((CVodeMem)cvode_mem)->cv_next_q = ((CVodeMem)cvode_mem)->cv_q;
        if (0 < ((CVodeMem)cvode_mem)->cv_nst) {
          uStack_440 = 0x4cabe6;
          iVar8 = (*((CVodeMem)cvode_mem)->cv_efun)
                            (((CVodeMem)cvode_mem)->cv_zn[0],((CVodeMem)cvode_mem)->cv_ewt,
                             ((CVodeMem)cvode_mem)->cv_e_data);
          if (iVar8 != 0) {
            pcVar13 = "At t = %lg, a component of ewt has become <= 0.";
            if (((CVodeMem)cvode_mem)->cv_itol == 3) {
              pcVar13 = "At t = %lg, the user-provide EwtSet function failed.";
            }
            iVar8 = -0x16;
            goto LAB_004ccdcf;
          }
        }
        if (((CVodeMem)cvode_mem)->cv_mxstep <= local_380 && 0 < ((CVodeMem)cvode_mem)->cv_mxstep) {
          pcVar13 = "At t = %lg, mxstep steps taken before reaching tout.";
          iVar8 = -1;
LAB_004ccdcf:
          uStack_440 = 0x4ccdd9;
          cvProcessError((CVodeMem)cvode_mem,iVar8,"CVODE","CVode",pcVar13);
LAB_004cccc9:
          rVar28 = ((CVodeMem)cvode_mem)->cv_tn;
          *local_3f8 = rVar28;
          ((CVodeMem)cvode_mem)->cv_tretlast = rVar28;
          uStack_440 = 0x4cccf8;
          N_VScale(1.0,((CVodeMem)cvode_mem)->cv_zn[0],local_3f0);
          return iVar8;
        }
        uStack_440 = 0x4cac1e;
        rVar28 = N_VWrmsNorm(((CVodeMem)cvode_mem)->cv_zn[0],((CVodeMem)cvode_mem)->cv_ewt);
        dVar30 = rVar28 * ((CVodeMem)cvode_mem)->cv_uround;
        ((CVodeMem)cvode_mem)->cv_tolsf = dVar30;
        if (1.0 < dVar30) {
          uStack_440 = 0x4ccd54;
          cvProcessError((CVodeMem)cvode_mem,-2,"CVODE","CVode",
                         "At t = %lg, too much accuracy requested.",((CVodeMem)cvode_mem)->cv_tn);
          rVar28 = ((CVodeMem)cvode_mem)->cv_tn;
          *local_3f8 = rVar28;
          ((CVodeMem)cvode_mem)->cv_tretlast = rVar28;
          uStack_440 = 0x4ccd83;
          N_VScale(1.0,((CVodeMem)cvode_mem)->cv_zn[0],local_3f0);
          ((CVodeMem)cvode_mem)->cv_tolsf =
               ((CVodeMem)cvode_mem)->cv_tolsf + ((CVodeMem)cvode_mem)->cv_tolsf;
          return -2;
        }
        uVar15 = 0;
        ((CVodeMem)cvode_mem)->cv_tolsf = 1.0;
        dVar30 = ((CVodeMem)cvode_mem)->cv_tn;
        dVar33 = dVar30 + ((CVodeMem)cvode_mem)->cv_h;
        if ((dVar33 == dVar30) && (!NAN(dVar33) && !NAN(dVar30))) {
          uVar2 = ((CVodeMem)cvode_mem)->cv_mxhnil;
          iVar8 = ((CVodeMem)cvode_mem)->cv_nhnil;
          uVar12 = iVar8 + 1;
          ((CVodeMem)cvode_mem)->cv_nhnil = uVar12;
          if (iVar8 < (int)uVar2) {
            uStack_440 = 0x4caca5;
            cvProcessError((CVodeMem)cvode_mem,99,"CVODE","CVode",
                           "Internal t = %lg and h = %lg are such that t + h = t on the next step. The solver will continue anyway."
                          );
            uVar2 = ((CVodeMem)cvode_mem)->cv_mxhnil;
            uVar12 = ((CVodeMem)cvode_mem)->cv_nhnil;
          }
          uVar15 = (ulong)uVar2;
          if (uVar12 == uVar2) {
            uStack_440 = 0x4cacd7;
            cvProcessError((CVodeMem)cvode_mem,99,"CVODE","CVode",
                           "The above warning has been issued mxhnil times and will not be issued again for this problem."
                          );
            uVar15 = extraout_RAX;
          }
        }
        npf = 0;
        if (0 < ((CVodeMem)cvode_mem)->cv_nst) {
          if ((((CVodeMem)cvode_mem)->cv_hprime != ((CVodeMem)cvode_mem)->cv_h) ||
             (NAN(((CVodeMem)cvode_mem)->cv_hprime) || NAN(((CVodeMem)cvode_mem)->cv_h))) {
            iVar8 = ((CVodeMem)cvode_mem)->cv_qprime - ((CVodeMem)cvode_mem)->cv_q;
            if (iVar8 != 0) {
              uStack_440 = 0x4cad13;
              cvAdjustOrder((CVodeMem)cvode_mem,iVar8);
              ((CVodeMem)cvode_mem)->cv_q = ((CVodeMem)cvode_mem)->cv_qprime;
              iVar8 = ((CVodeMem)cvode_mem)->cv_qprime + 1;
              ((CVodeMem)cvode_mem)->cv_L = iVar8;
              ((CVodeMem)cvode_mem)->cv_qwait = iVar8;
            }
            uStack_440 = 0x4cad35;
            cvRescale((CVodeMem)cvode_mem);
            uVar15 = extraout_RAX_00;
          }
        }
        local_400 = (double)CONCAT44(local_400._4_4_,(int)CONCAT71((int7)(uVar15 >> 8),1));
        if (((CVodeMem)cvode_mem)->proj_enabled != 0) {
          pCVar3 = ((CVodeMem)cvode_mem)->proj_mem;
          if (0 < pCVar3->freq) {
            if (((CVodeMem)cvode_mem)->cv_nst == 0) {
              local_400 = (double)((ulong)local_400._4_4_ << 0x20);
            }
            else {
              local_400 = (double)CONCAT44(local_400._4_4_,
                                           (int)CONCAT71((int7)((ulong)pCVar3 >> 8),
                                                         ((CVodeMem)cvode_mem)->cv_nst <
                                                         pCVar3->freq + pCVar3->nstlprj));
            }
          }
        }
        local_398 = (realtype *)((CVodeMem)cvode_mem)->cv_tn;
        local_40c = 6;
        local_3b4 = 0;
        local_3a8 = 0;
        local_3d8 = prVar16;
LAB_004cadad:
        dVar30 = ((CVodeMem)cvode_mem)->cv_tn + ((CVodeMem)cvode_mem)->cv_h;
        ((CVodeMem)cvode_mem)->cv_tn = dVar30;
        if ((((CVodeMem)cvode_mem)->cv_tstopset != 0) &&
           (0.0 < ((CVodeMem)cvode_mem)->cv_h * (dVar30 - ((CVodeMem)cvode_mem)->cv_tstop))) {
          ((CVodeMem)cvode_mem)->cv_tn = ((CVodeMem)cvode_mem)->cv_tstop;
        }
        lVar14 = 1;
        while( true ) {
          uVar12 = ((CVodeMem)cvode_mem)->cv_q;
          uVar15 = (ulong)uVar12;
          lVar25 = (long)(int)uVar12;
          if (lVar25 < lVar14) break;
          for (; lVar14 <= lVar25; lVar25 = lVar25 + -1) {
            uStack_440 = 0x4cae34;
            N_VLinearSum(1.0,pCVar5->cv_zn[lVar25 + -1],1.0,Y[lVar25],pCVar5->cv_zn[lVar25 + -1]);
          }
          lVar14 = lVar14 + 1;
        }
        if (((CVodeMem)cvode_mem)->cv_lmm == 2) {
          *local_3a0 = 1.0;
          local_3a0[1] = 1.0;
          for (lVar14 = 0x45; lVar14 + -0x43 <= lVar25; lVar14 = lVar14 + 1) {
            ((CVodeMem)cvode_mem)->cv_zn[lVar14 + -0xc] = (N_Vector)0x0;
          }
          dVar30 = ((CVodeMem)cvode_mem)->cv_h;
          iVar8 = ((CVodeMem)cvode_mem)->proj_enabled;
          if (iVar8 != 0) {
            lVar14 = -1;
            if (-1 < lVar25) {
              lVar14 = lVar25;
            }
            for (lVar19 = 0; lVar14 + 1 != lVar19; lVar19 = lVar19 + 1) {
              local_3d8[lVar19] = local_3d8[lVar19 + -0x7d];
            }
          }
          if ((int)uVar12 < 2) {
            dVar35 = -1.0;
            dVar37 = -1.0;
            dVar39 = 1.0;
            dVar38 = 1.0;
            dVar33 = dVar30;
          }
          else {
            dVar37 = -1.0;
            prVar16 = local_350;
            dVar33 = dVar30;
            for (uVar10 = 2; uVar10 != uVar15; uVar10 = uVar10 + 1) {
              dVar33 = dVar33 + ((CVodeMem)cvode_mem)->cv_tau[uVar10 - 1];
              for (lVar14 = 0; 0 < (long)(uVar10 + lVar14); lVar14 = lVar14 + -1) {
                prVar16[lVar14] = prVar16[lVar14 + -1] * (dVar30 / dVar33) + prVar16[lVar14];
              }
              dVar37 = dVar37 + -1.0 / (double)(int)uVar10;
              prVar16 = prVar16 + 1;
            }
            dVar37 = dVar37 + -1.0 / (double)(int)uVar12;
            dVar38 = -((CVodeMem)cvode_mem)->cv_l[1] - dVar37;
            dVar33 = dVar33 + ((CVodeMem)cvode_mem)->cv_tau[lVar25 + -1];
            dVar39 = dVar30 / dVar33;
            dVar35 = -((CVodeMem)cvode_mem)->cv_l[1] - dVar39;
            uVar10 = uVar15;
            if (iVar8 != 0) {
              for (; 0 < (long)uVar10; uVar10 = uVar10 - 1) {
                local_3d8[uVar10] = local_3d8[uVar10 - 1] * dVar39 + local_3d8[uVar10 - 0x7d];
              }
            }
            for (; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
              local_3a0[uVar15] = local_3a0[uVar15 - 1] * dVar38 + local_3a0[uVar15];
            }
          }
          dVar40 = (1.0 - dVar35) + dVar37;
          dVar34 = (double)(int)uVar12 * dVar40 + 1.0;
          uVar15 = (ulong)DAT_006f4890;
          dVar41 = (double)((ulong)(dVar40 / (dVar37 * dVar34)) & uVar15);
          ((CVodeMem)cvode_mem)->cv_tq[2] = dVar41;
          dVar40 = ((CVodeMem)cvode_mem)->cv_l[lVar25];
          ((CVodeMem)cvode_mem)->cv_tq[5] =
               (realtype)((ulong)((dVar38 * dVar34) / (dVar39 * dVar40)) & uVar15);
          if (((CVodeMem)cvode_mem)->cv_qwait == 1) {
            rVar28 = 1.0;
            if (1 < (int)uVar12) {
              dVar42 = 1.0 / (double)(int)uVar12 + dVar37;
              auVar43._0_8_ = (1.0 - (dVar39 + dVar35)) + dVar42;
              auVar43._8_8_ = dVar38;
              auVar32._8_8_ = dVar40;
              auVar32._0_8_ = dVar42;
              auVar32 = divpd(auVar43,auVar32);
              rVar28 = ABS(auVar32._8_8_ * auVar32._0_8_);
            }
            ((CVodeMem)cvode_mem)->cv_tq[1] = rVar28;
            dVar30 = dVar30 / (dVar33 + ((CVodeMem)cvode_mem)->cv_tau[lVar25]);
            dVar37 = dVar37 - 1.0 / (double)(int)(uVar12 + 1);
            ((CVodeMem)cvode_mem)->cv_tq[3] =
                 ABS((((dVar30 - dVar35) + 1.0 + dVar37) / dVar34) /
                     ((double)(int)(uVar12 + 2) * dVar30 * dVar37));
          }
          rVar28 = ((CVodeMem)cvode_mem)->cv_nlscoef / dVar41;
LAB_004cb415:
          ((CVodeMem)cvode_mem)->cv_tq[4] = rVar28;
        }
        else if (((CVodeMem)cvode_mem)->cv_lmm == 1) {
          if (uVar12 == 1) {
            ((CVodeMem)cvode_mem)->cv_l[1] = 1.0;
            ((CVodeMem)cvode_mem)->cv_tq[5] = 1.0;
            ((CVodeMem)cvode_mem)->cv_l[0] = 1.0;
            ((CVodeMem)cvode_mem)->cv_tq[1] = 1.0;
            ((CVodeMem)cvode_mem)->cv_tq[2] = 0.5;
            ((CVodeMem)cvode_mem)->cv_tq[3] = 0.08333333333333333;
            rVar28 = ((CVodeMem)cvode_mem)->cv_nlscoef + ((CVodeMem)cvode_mem)->cv_nlscoef;
          }
          else {
            local_428 = ((CVodeMem)cvode_mem)->cv_h;
            nni_inc = 0x3ff0000000000000;
            uVar2 = uVar12;
            if ((int)uVar12 < 1) {
              uVar2 = 0;
            }
            for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
              local_320[uVar10] = 0.0;
            }
            iend = uVar12 - 1;
            local_3c8 = (double)CONCAT44(local_3c8._4_4_,uVar12 - 2);
            local_378 = (double)(int)uVar12;
            rVar28 = local_428;
            local_3e8 = local_428;
            for (uVar10 = 1; (long)uVar10 < lVar25; uVar10 = uVar10 + 1) {
              if ((uVar10 == iend) && (local_430->cv_qwait == 1)) {
                uStack_440 = 0x4cb034;
                rVar28 = cvAltSum(local_3c8._0_4_,(realtype *)&nni_inc,2);
                local_430->cv_tq[1] = (rVar28 * local_378) / ssmax[lVar25 + 2];
                rVar28 = local_3e8;
              }
              for (uVar11 = uVar10; 0 < (long)uVar11; uVar11 = uVar11 - 1) {
                local_320[uVar11 - 1] =
                     ssmax[uVar11 + 3] * (rVar28 / local_428) + local_320[uVar11 - 1];
              }
              local_428 = local_428 + local_430->cv_tau[uVar10];
            }
            uStack_440 = 0x4cb0c6;
            local_3c8 = cvAltSum(iend,(realtype *)&nni_inc,1);
            uStack_440 = 0x4cb0da;
            rVar28 = cvAltSum(iend,(realtype *)&nni_inc,2);
            cvode_mem = local_430;
            dVar30 = 1.0 / local_3c8;
            *local_3a0 = 1.0;
            uVar10 = 0;
            while (uVar2 != uVar10) {
              local_430->cv_l[uVar10 + 1] =
                   (local_320[uVar10 - 1] / (double)(int)(uVar10 + 1)) * dVar30;
              uVar10 = uVar10 + 1;
            }
            dVar37 = local_428 / local_3e8;
            dVar33 = (rVar28 * dVar30) / dVar37;
            local_430->cv_tq[2] = dVar33;
            local_430->cv_tq[5] = dVar37 / local_430->cv_l[lVar25];
            if (local_430->cv_qwait == 1) {
              for (; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
                local_320[uVar15 - 1] = ssmax[uVar15 + 3] * (1.0 / dVar37) + local_320[uVar15 - 1];
              }
              uStack_440 = 0x4cb3dc;
              local_428 = dVar33;
              local_3e8 = dVar30;
              rVar28 = cvAltSum(uVar12,(realtype *)&nni_inc,2);
              ((CVodeMem)cvode_mem)->cv_tq[3] =
                   (local_3e8 * rVar28) / (double)((CVodeMem)cvode_mem)->cv_L;
              dVar33 = local_428;
            }
            rVar28 = ((CVodeMem)cvode_mem)->cv_nlscoef / dVar33;
          }
          goto LAB_004cb415;
        }
        pCVar21 = local_430;
        dVar33 = 1.0;
        dVar30 = 1.0 / ((CVodeMem)cvode_mem)->cv_l[1];
        ((CVodeMem)cvode_mem)->cv_rl1 = dVar30;
        dVar30 = dVar30 * ((CVodeMem)cvode_mem)->cv_h;
        ((CVodeMem)cvode_mem)->cv_gamma = dVar30;
        lVar14 = ((CVodeMem)cvode_mem)->cv_nst;
        if (lVar14 == 0) {
          ((CVodeMem)cvode_mem)->cv_gammap = dVar30;
        }
        else if (0 < lVar14) {
          dVar33 = dVar30 / ((CVodeMem)cvode_mem)->cv_gammap;
        }
        ((CVodeMem)cvode_mem)->cv_gamrat = dVar33;
        nni_inc = 0;
        local_208[0] = 0;
        if (((CVodeMem)cvode_mem)->cv_lsetup ==
            (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector *)
            0x0) {
          ((CVodeMem)cvode_mem)->cv_crate = 1.0;
          uVar12 = 0;
        }
        else {
          iVar8 = (uint)(local_40c != 9) * 2;
          if (local_40c == 6) {
            iVar8 = 0;
          }
          ((CVodeMem)cvode_mem)->convfail = iVar8;
          uVar12 = 1;
          if ((((local_40c != 7) && (local_40c != 9)) && (lVar14 != 0)) &&
             (lVar14 < local_430->cv_msbp + local_430->cv_nstlp)) {
            uVar12 = (uint)(local_430->cv_dgmax_lsetup <= ABS(dVar33 + -1.0) &&
                           ABS(dVar33 + -1.0) != local_430->cv_dgmax_lsetup);
          }
        }
        uStack_440 = 0x4cb529;
        N_VConst(0.0,local_430->cv_acor);
        NLS = pCVar21->NLS;
        if (NLS->ops->setup == (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0) {
LAB_004cb564:
          uStack_440 = 0x4cb589;
          iVar8 = SUNNonlinSolSolve(NLS,pCVar21->cv_zn[0],pCVar21->cv_acor,pCVar21->cv_ewt,
                                    pCVar21->cv_tq[4],uVar12,pCVar21);
          uStack_440 = 0x4cb5a0;
          SUNNonlinSolGetNumIters(pCVar21->NLS,&nni_inc);
          pCVar21->cv_nni = pCVar21->cv_nni + nni_inc;
          uStack_440 = 0x4cb5c3;
          SUNNonlinSolGetNumConvFails(pCVar21->NLS,local_208);
          pCVar21->cv_nnf = pCVar21->cv_nnf + local_208[0];
          if (iVar8 != 0) goto LAB_004cb8ff;
          uStack_440 = 0x4cb5fe;
          N_VLinearSum(1.0,pCVar21->cv_zn[0],1.0,pCVar21->cv_acor,pCVar21->cv_y);
          if (pCVar21->cv_acnrmcur == 0) {
            uStack_440 = 0x4cb61a;
            rVar28 = N_VWrmsNorm(pCVar21->cv_acor,pCVar21->cv_ewt);
            pCVar21->cv_acnrm = rVar28;
          }
          pCVar21->cv_jcur = 0;
          if (pCVar21->cv_constraintsSet != 0) {
            p_Var23 = pCVar21->cv_ftemp;
            p_Var4 = pCVar21->cv_tempv;
            uStack_440 = 0x4cb657;
            iVar8 = N_VConstrMask(pCVar21->cv_constraints,pCVar21->cv_y,p_Var23);
            if (iVar8 == 0) {
              uStack_440 = 0x4cb676;
              N_VCompare(1.5,pCVar21->cv_constraints,p_Var4);
              uStack_440 = 0x4cb688;
              N_VProd(p_Var4,pCVar21->cv_constraints,p_Var4);
              uStack_440 = 0x4cb69a;
              N_VDiv(p_Var4,pCVar21->cv_ewt,p_Var4);
              uStack_440 = 0x4cb6bc;
              N_VLinearSum(1.0,pCVar21->cv_y,-0.1,p_Var4,p_Var4);
              uStack_440 = 0x4cb6ca;
              N_VProd(p_Var4,p_Var23,p_Var4);
              uStack_440 = 0x4cb6d9;
              rVar28 = N_VWrmsNorm(p_Var4,pCVar21->cv_ewt);
              pCVar6 = local_430;
              if (pCVar21->cv_tq[4] < rVar28) {
                iVar8 = -0xf;
                if (pCVar21->cv_hmin * 1.000001 < ABS(pCVar21->cv_h)) {
                  uStack_440 = 0x4cbab6;
                  N_VLinearSum(1.0,local_430->cv_zn[0],-1.0,local_430->cv_y,p_Var4);
                  uStack_440 = 0x4cbac4;
                  N_VProd(p_Var23,p_Var4,p_Var4);
                  uStack_440 = 0x4cbad0;
                  rVar28 = N_VMinQuotient(pCVar6->cv_zn[0],p_Var4);
                  dVar30 = rVar28 * 0.9;
                  if (dVar30 <= 0.1) {
                    dVar30 = 0.1;
                  }
                  dVar33 = pCVar6->cv_hmin / ABS(pCVar6->cv_h);
                  if (dVar30 <= dVar33) {
                    dVar30 = dVar33;
                  }
                  pCVar6->cv_eta = dVar30;
                  iVar8 = 0xb;
                }
                goto LAB_004cb8ff;
              }
              uStack_440 = 0x4cb70d;
              N_VLinearSum(1.0,pCVar21->cv_acor,-1.0,p_Var4,pCVar21->cv_acor);
            }
          }
          prVar22 = local_3d8;
          local_40c = 0;
          pCVar21->proj_applied = 0;
          cvode_mem = pCVar21;
          if ((char)local_400 == '\0') goto code_r0x004cb728;
          goto LAB_004cb757;
        }
        uStack_440 = 0x4cb54a;
        iVar8 = SUNNonlinSolSetup(NLS,pCVar21->cv_acor,pCVar21);
        if (iVar8 < 0) {
          iVar8 = -0xe;
        }
        else {
          if (iVar8 == 0) {
            NLS = local_430->NLS;
            pCVar21 = local_430;
            goto LAB_004cb564;
          }
          iVar8 = 0x386;
        }
LAB_004cb8ff:
        cvode_mem = local_430;
        local_430->cv_ncfn = local_430->cv_ncfn + 1;
        uStack_440 = 0x4cb921;
        local_40c = iVar8;
        cvRestore(local_430,(realtype)local_398);
        if (iVar8 < 0) {
          iVar9 = -0x10;
          if (iVar8 + 8U < 3) {
            iVar9 = iVar8;
          }
          goto LAB_004cccbc;
        }
        local_3b4 = local_3b4 + 1;
        ((CVodeMem)cvode_mem)->cv_etamax = 1.0;
        if ((((CVodeMem)cvode_mem)->cv_hmin * 1.000001 < ABS(((CVodeMem)cvode_mem)->cv_h)) &&
           (local_3b4 != ((CVodeMem)cvode_mem)->cv_maxncf)) {
          if (iVar8 != 0xb) {
LAB_004cb99e:
            dVar33 = ((CVodeMem)cvode_mem)->cv_hmin / ABS(((CVodeMem)cvode_mem)->cv_h);
            dVar30 = ((CVodeMem)cvode_mem)->cv_eta_cf;
            if (((CVodeMem)cvode_mem)->cv_eta_cf <= dVar33) {
              dVar30 = dVar33;
            }
            ((CVodeMem)cvode_mem)->cv_eta = dVar30;
          }
          local_40c = 7;
          uStack_440 = 0x4cb9c6;
          cvRescale((CVodeMem)cvode_mem);
          goto LAB_004cadad;
        }
        if (iVar8 == 10) {
          iVar9 = -10;
        }
        else if (iVar8 == 0xb) {
          iVar9 = -0xf;
        }
        else {
          if (iVar8 != 0x386) goto LAB_004cb99e;
          iVar9 = -4;
        }
        goto LAB_004cccbc;
      }
      rVar28 = *(realtype *)((long)cvode_mem + 0x168);
      *tret = rVar28;
      *(realtype *)((long)cvode_mem + 0x170) = rVar28;
      if (*(int *)((long)cvode_mem + 0x24) == 0) {
        pcVar13 = "cvInitialSetup";
        pcVar24 = "No integration tolerances have been specified.";
      }
      else {
        if (*(int *)((long)cvode_mem + 0x44) == 0) {
          pvVar18 = cvode_mem;
          if ((*(int *)((long)cvode_mem + 0x40) != 0) &&
             (*(long *)(*(long *)(*(long *)((long)cvode_mem + 0xe0) + 8) + 0xb0) == 0)) {
            pcVar13 = "cvInitialSetup";
            pcVar24 = "Missing N_VMin routine from N_Vector";
            goto LAB_004ca40f;
          }
        }
        else {
          pvVar18 = *(void **)((long)cvode_mem + 0x18);
        }
        *(void **)((long)cvode_mem + 0x50) = pvVar18;
        if (*(int *)((long)cvode_mem + 0x58) != 0) {
          uStack_440 = 0x4ca589;
          iVar8 = N_VConstrMask(*(N_Vector *)((long)cvode_mem + 0x108),
                                *(N_Vector *)((long)cvode_mem + 0x60),
                                *(N_Vector *)((long)cvode_mem + 0xe0));
          if (iVar8 == 0) {
            pcVar13 = "cvInitialSetup";
            pcVar24 = "y0 fails to satisfy constraints.";
            goto LAB_004ca40f;
          }
          pvVar18 = *(void **)((long)cvode_mem + 0x50);
        }
        uStack_440 = 0x4ca5a3;
        iVar8 = (**(code **)((long)cvode_mem + 0x48))
                          (*(undefined8 *)((long)cvode_mem + 0x60),
                           *(undefined8 *)((long)cvode_mem + 200),pvVar18);
        if (iVar8 == 0) {
          if (*(code **)((long)cvode_mem + 1000) != (code *)0x0) {
            uStack_440 = 0x4ca641;
            iVar8 = (**(code **)((long)cvode_mem + 1000))(cvode_mem);
            if (iVar8 != 0) {
              pcVar13 = "cvInitialSetup";
              pcVar24 = "The linear solver\'s init routine failed.";
              iVar8 = -5;
              goto LAB_004ca416;
            }
          }
          uStack_440 = 0x4ca7c8;
          iVar8 = cvNlsInit((CVodeMem)cvode_mem);
          if (iVar8 != 0) {
            pcVar13 = "cvInitialSetup";
            pcVar24 = "The nonlinear solver\'s init routine failed.";
            iVar8 = -0xd;
            goto LAB_004ca416;
          }
          pCVar3 = *(CVodeProjMem *)((long)cvode_mem + 0x5f0);
          if (*(int *)((long)cvode_mem + 0x5f8) == 0) {
            if (pCVar3 != (CVodeProjMem)0x0) goto LAB_004ca900;
          }
          else {
            if (pCVar3 == (CVodeProjMem)0x0) {
              pcVar13 = "cvInitialSetup";
              pcVar24 = "proj_mem = NULL illegal.";
              iVar8 = -0x1d;
              goto LAB_004ca416;
            }
LAB_004ca900:
            uStack_440 = 0x4ca905;
            iVar8 = cvProjInit(pCVar3);
            if (iVar8 != 0) {
              pcVar13 = "cvInitialSetup";
              pcVar24 = "A memory request failed.";
              iVar8 = -0x14;
              goto LAB_004ca416;
            }
            *(undefined4 *)((long)cvode_mem + 0x5fc) = 0;
          }
          uStack_440 = 0x4ccdfc;
          iVar8 = (**(code **)((long)cvode_mem + 0x10))
                            (*(undefined8 *)((long)cvode_mem + 0x168),
                             *(undefined8 *)((long)cvode_mem + 0x60),
                             *(undefined8 *)((long)cvode_mem + 0x68),
                             *(undefined8 *)((long)cvode_mem + 0x18));
          pCVar5 = local_430;
          *(long *)((long)cvode_mem + 0x360) = *(long *)((long)cvode_mem + 0x360) + 1;
          if (iVar8 < 0) {
            pcVar13 = "CVode";
            pcVar24 = "At t = %lg, the right-hand side routine failed in an unrecoverable manner.";
            iVar8 = -8;
            goto LAB_004caa59;
          }
          if (iVar8 != 0) {
            pcVar13 = "CVode";
            pcVar24 = "The right-hand side routine failed at the first call.";
            iVar8 = -9;
            goto LAB_004ca416;
          }
          local_3b0 = uVar15;
          if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
             ((local_408 - *(double *)((long)cvode_mem + 0x168)) *
              (*(double *)((long)cvode_mem + 0x118) - *(double *)((long)cvode_mem + 0x168)) <= 0.0))
          goto LAB_004ccbf7;
          dVar30 = *(double *)((long)cvode_mem + 0x138);
          *(double *)((long)cvode_mem + 0x140) = dVar30;
          if (((dVar30 != 0.0) || (NAN(dVar30))) &&
             ((local_408 - *(double *)((long)cvode_mem + 0x168)) * dVar30 < 0.0)) {
            pcVar13 = "CVode";
            pcVar24 = "h0 and tout - t0 inconsistent.";
            goto LAB_004ca40f;
          }
          if ((dVar30 == 0.0) && (!NAN(dVar30))) {
            dVar30 = local_430->cv_tn;
            rVar28 = local_408;
            if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
               (0.0 < (local_408 - local_430->cv_tstop) * (local_408 - dVar30))) {
              rVar28 = local_430->cv_tstop;
            }
            local_3c8 = rVar28 - dVar30;
            uStack_440 = 0xffffffffffffffe5;
            iVar8 = -0x1b;
            dStack_3c0 = 0.0;
            if ((local_3c8 == 0.0) && (!NAN(local_3c8))) {
LAB_004ccfba:
              iVar8 = cvHandleFailure(local_430,iVar8);
              return iVar8;
            }
            local_428 = ABS(local_3c8);
            dVar33 = ABS(dVar30);
            if (ABS(dVar30) <= ABS(rVar28)) {
              dVar33 = ABS(rVar28);
            }
            dVar33 = dVar33 * local_430->cv_uround;
            uStack_420 = 0;
            if (local_428 < dVar33 + dVar33) goto LAB_004ccfba;
            local_3d8 = (realtype *)(dVar33 * 100.0);
            uStack_3d0 = 0;
            p_Var23 = local_430->cv_tempv;
            p_Var4 = local_430->cv_acor;
            uStack_440 = 0x4cd113;
            N_VAbs(local_430->cv_zn[0],p_Var4);
            uStack_440 = 0x4cd121;
            (*pCVar5->cv_efun)(pCVar5->cv_zn[0],p_Var23,pCVar5->cv_e_data);
            uStack_440 = 0x4cd12c;
            N_VInv(p_Var23,p_Var23);
            uStack_440 = 0x4cd14a;
            N_VLinearSum(0.1,p_Var4,1.0,p_Var23,p_Var23);
            uStack_440 = 0x4cd156;
            N_VAbs(pCVar5->cv_zn[1],p_Var4);
            uStack_440 = 0x4cd164;
            N_VDiv(p_Var4,p_Var23,p_Var23);
            uStack_440 = 0x4cd16c;
            rVar28 = N_VMaxNorm(p_Var23);
            uVar15 = -(ulong)(1.0 < local_428 * 0.1 * rVar28);
            local_398 = (realtype *)
                        (~uVar15 & (ulong)(local_428 * 0.1) | (ulong)(1.0 / rVar28) & uVar15);
            uStack_390 = uStack_420;
            dVar33 = (double)local_398 * (double)local_3d8;
            dVar30 = 0.0;
            uVar15 = 0;
            if (0.0 < dVar33) {
              if (dVar33 < 0.0) {
                uStack_440 = 0x4cd1d9;
                dVar30 = sqrt(dVar33);
                uVar15 = extraout_XMM0_Qb_00;
              }
              else {
                dVar30 = SQRT(dVar33);
                uVar15 = 0;
              }
            }
            pCVar5 = local_430;
            if ((double)local_3d8 <= (double)local_398) {
              uVar12 = 1;
              local_378 = (double)-(ulong)(local_3c8 <= 0.0);
              uStack_370 = 0;
              iVar8 = -8;
              local_400 = dVar30;
              while( true ) {
                iVar9 = 4;
                uStack_420 = uVar15;
                while( true ) {
                  bVar27 = iVar9 == 0;
                  iVar9 = iVar9 + -1;
                  local_428 = dVar30;
                  if (bVar27) {
                    if (2 < uVar12) goto LAB_004cd3e7;
                    uStack_440 = 0xfffffffffffffff6;
                    iVar8 = -10;
                    goto LAB_004ccfba;
                  }
                  local_3e8 = (double)(~(ulong)local_378 & (ulong)dVar30 |
                                      (ulong)-dVar30 & (ulong)local_378);
                  uStack_3e0 = ~uStack_370 & uStack_420 |
                               (uStack_420 ^ 0x8000000000000000) & uStack_370;
                  uStack_440 = 0x4cd290;
                  N_VLinearSum(local_3e8,pCVar5->cv_zn[1],1.0,pCVar5->cv_zn[0],pCVar5->cv_y);
                  uStack_440 = 0x4cd2b5;
                  iVar7 = (*pCVar5->cv_f)(pCVar5->cv_tn + local_3e8,pCVar5->cv_y,pCVar5->cv_tempv,
                                          pCVar5->cv_user_data);
                  pCVar21 = local_430;
                  pCVar5->cv_nfe = pCVar5->cv_nfe + 1;
                  if (iVar7 < 0) goto LAB_004ccfba;
                  if (iVar7 == 0) break;
                  dVar30 = local_428 * 0.2;
                }
                uStack_440 = 0x4cd30f;
                N_VLinearSum(1.0 / local_3e8,local_430->cv_tempv,-1.0 / local_3e8,
                             local_430->cv_zn[1],local_430->cv_tempv);
                uStack_440 = 0x4cd322;
                rVar28 = N_VWrmsNorm(pCVar21->cv_tempv,pCVar21->cv_ewt);
                if ((double)local_398 * rVar28 * (double)local_398 <= 2.0) {
                  dVar33 = (double)local_398 * local_428;
                }
                else {
                  dVar33 = 2.0 / rVar28;
                }
                dVar30 = 0.0;
                uVar15 = 0;
                if (0.0 < dVar33) {
                  if (dVar33 < 0.0) {
                    uStack_440 = 0x4cd381;
                    dVar30 = sqrt(dVar33);
                    uVar15 = extraout_XMM0_Qb_01;
                  }
                  else {
                    dVar30 = SQRT(dVar33);
                    uVar15 = 0;
                  }
                }
                local_400 = dVar30;
                if (((uVar12 == 4) ||
                    ((dVar33 = dVar30 / local_428, 0.5 < dVar33 && (dVar33 < 2.0)))) ||
                   ((1 < uVar12 && (local_400 = local_428, 2.0 < dVar33)))) break;
                uVar12 = uVar12 + 1;
                local_400 = local_428;
              }
LAB_004cd3e7:
              prVar16 = local_3d8;
              if ((double)local_3d8 <= local_400 * 0.5) {
                prVar16 = (realtype *)(local_400 * 0.5);
              }
              prVar22 = local_398;
              if ((double)prVar16 <= (double)local_398) {
                prVar22 = prVar16;
              }
              dVar30 = (double)(-(ulong)(local_3c8 <= 0.0) & ((ulong)prVar22 ^ 0x8000000000000000) |
                               ~-(ulong)(local_3c8 <= 0.0) & (ulong)prVar22);
            }
            else if (local_3c8 <= 0.0) {
              dVar30 = -dVar30;
            }
            local_430->cv_h = dVar30;
          }
          pCVar5 = local_430;
          dVar33 = ABS(dVar30);
          dVar37 = dVar33 * local_430->cv_hmax_inv;
          if (1.0 < dVar37) {
            dVar30 = dVar30 / dVar37;
            local_430->cv_h = dVar30;
            dVar33 = ABS(dVar30);
          }
          if (dVar33 < local_430->cv_hmin) {
            dVar30 = dVar30 * (local_430->cv_hmin / dVar33);
            local_430->cv_h = dVar30;
          }
          if (local_430->cv_tstopset != 0) {
            if (0.0 < ((local_430->cv_tn + dVar30) - local_430->cv_tstop) * dVar30) {
              dVar30 = (local_430->cv_uround * -4.0 + 1.0) *
                       (local_430->cv_tstop - local_430->cv_tn);
              local_430->cv_h = dVar30;
            }
          }
          local_430->cv_hscale = dVar30;
          local_430->cv_h0u = dVar30;
          local_430->cv_hprime = dVar30;
          uStack_440 = 0x4cd53c;
          N_VScale(dVar30,local_430->cv_zn[1],local_430->cv_zn[1]);
          pCVar21 = local_430;
          iVar8 = pCVar5->cv_nrtfn;
          if (iVar8 < 1) {
LAB_004cd729:
            lVar14 = local_430->cv_nst;
            uVar15 = local_3b0;
            goto LAB_004ca465;
          }
          for (lVar14 = 0; lVar14 < iVar8; lVar14 = lVar14 + 1) {
            local_430->cv_iroots[lVar14] = 0;
            iVar8 = local_430->cv_nrtfn;
          }
          dVar30 = local_430->cv_tn;
          local_430->cv_tlo = dVar30;
          local_430->cv_ttol = (ABS(local_430->cv_h) + ABS(dVar30)) * local_430->cv_uround * 100.0;
          uStack_440 = 0x4cd5c9;
          iVar8 = (*local_430->cv_gfun)
                            (dVar30,local_430->cv_zn[0],local_430->cv_glo,local_430->cv_user_data);
          pCVar5 = local_430;
          pCVar21->cv_nge = 1;
          if (iVar8 == 0) {
            bVar27 = false;
            for (lVar14 = 0; lVar14 < local_430->cv_nrtfn; lVar14 = lVar14 + 1) {
              if ((local_430->cv_glo[lVar14] == 0.0) && (!NAN(local_430->cv_glo[lVar14]))) {
                local_430->cv_gactive[lVar14] = 0;
                bVar27 = true;
              }
            }
            if (bVar27) {
              dVar30 = local_430->cv_ttol / ABS(local_430->cv_h);
              if (dVar30 <= 0.1) {
                dVar30 = 0.1;
              }
              local_428 = local_430->cv_h * dVar30 + local_430->cv_tlo;
              uStack_420 = 0;
              uStack_440 = 0x4cd69d;
              N_VLinearSum(1.0,local_430->cv_zn[0],dVar30,local_430->cv_zn[1],local_430->cv_y);
              uStack_440 = 0x4cd6bb;
              iVar8 = (*pCVar5->cv_gfun)(local_428,pCVar5->cv_y,pCVar5->cv_ghi,pCVar5->cv_user_data)
              ;
              pCVar5->cv_nge = pCVar5->cv_nge + 1;
              if (iVar8 != 0) goto LAB_004cd5d8;
              for (lVar14 = 0; lVar14 < local_430->cv_nrtfn; lVar14 = lVar14 + 1) {
                if (local_430->cv_gactive[lVar14] == 0) {
                  dVar30 = local_430->cv_ghi[lVar14];
                  if ((dVar30 != 0.0) || (NAN(dVar30))) {
                    local_430->cv_gactive[lVar14] = 1;
                    local_430->cv_glo[lVar14] = dVar30;
                  }
                }
              }
            }
            goto LAB_004cd729;
          }
LAB_004cd5d8:
          pcVar13 = "cvRcheck1";
LAB_004ccc95:
          pcVar24 = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
          iVar8 = -0xc;
          cvode_mem = local_430;
          goto LAB_004caa59;
        }
        if (*(int *)((long)cvode_mem + 0x24) == 3) {
          pcVar13 = "cvInitialSetup";
          pcVar24 = "The user-provide EwtSet function failed.";
        }
        else {
          pcVar13 = "cvInitialSetup";
          pcVar24 = "Initial ewt has component(s) equal to zero (illegal).";
        }
      }
    }
  }
LAB_004ca40f:
  iVar8 = -0x16;
LAB_004ca416:
  uStack_440 = 0x4ca420;
  cvProcessError((CVodeMem)cvode_mem,iVar8,"CVODE",pcVar13,pcVar24);
  return iVar8;
code_r0x004cb728:
  uStack_440 = 0x4cb746;
  iVar9 = cvDoProjection(pCVar21,&local_40c,(realtype)local_398,&npf);
  if (iVar9 == 3) goto LAB_004cadad;
  if (iVar9 != 0) {
LAB_004cccbc:
    uStack_440 = 0x4cccc6;
    iVar8 = cvHandleFailure((CVodeMem)cvode_mem,iVar9);
    goto LAB_004cccc9;
  }
LAB_004cb757:
  local_428 = pCVar21->cv_acnrm * pCVar21->cv_tq[2];
  if (local_428 <= 1.0) goto LAB_004cbb0f;
  pCVar21->cv_netf = pCVar21->cv_netf + 1;
  local_40c = 9;
  uStack_440 = 0x4cb79f;
  cvRestore(pCVar21,(realtype)local_398);
  dVar30 = ABS(pCVar21->cv_h);
  if (dVar30 <= pCVar21->cv_hmin * 1.000001) {
    iVar9 = -3;
    goto LAB_004cccbc;
  }
  uVar12 = (int)local_3a8 + 1;
  if (uVar12 == pCVar21->cv_maxnef) {
    iVar9 = -3;
    goto LAB_004cccbc;
  }
  pCVar21->cv_etamax = 1.0;
  if ((int)local_3a8 < 3) {
    uStack_440 = 0x4cb82f;
    rVar28 = SUNRpowerR(local_428 * 6.0,1.0 / (double)pCVar21->cv_L);
    auVar29._0_8_ = rVar28 + 1e-06;
    auVar29._8_8_ = ABS(pCVar21->cv_h);
    auVar31._8_8_ = pCVar21->cv_hmin;
    auVar31._0_8_ = 0x3ff0000000000000;
    auVar32 = divpd(auVar31,auVar29);
    dVar30 = auVar32._0_8_;
    if (auVar32._0_8_ <= auVar32._8_8_) {
      dVar30 = auVar32._8_8_;
    }
    dVar33 = pCVar21->cv_eta_min_ef;
    if (pCVar21->cv_eta_min_ef <= dVar30) {
      dVar33 = dVar30;
    }
    pCVar21->cv_eta = dVar33;
    if (pCVar21->cv_small_nef <= (int)uVar12) {
      if (pCVar21->cv_eta_max_ef <= dVar33) {
        dVar33 = pCVar21->cv_eta_max_ef;
      }
      pCVar21->cv_eta = dVar33;
    }
  }
  else {
    dVar30 = pCVar21->cv_hmin / dVar30;
    dVar33 = pCVar21->cv_eta_min_ef;
    if (pCVar21->cv_eta_min_ef <= dVar30) {
      dVar33 = dVar30;
    }
    pCVar21->cv_eta = dVar33;
    if (pCVar21->cv_q < 2) {
      dVar33 = pCVar21->cv_h * dVar33;
      pCVar21->cv_h = dVar33;
      pCVar21->cv_next_h = dVar33;
      pCVar21->cv_hscale = dVar33;
      pCVar21->cv_qwait = 10;
      pCVar21->cv_nscon = 0;
      uStack_440 = 0x4cba1a;
      iVar8 = (*pCVar21->cv_f)(pCVar21->cv_tn,pCVar21->cv_zn[0],pCVar21->cv_tempv,
                               pCVar21->cv_user_data);
      cvode_mem = local_430;
      pCVar21->cv_nfe = pCVar21->cv_nfe + 1;
      if (iVar8 < 0) {
        iVar9 = -8;
        goto LAB_004cccbc;
      }
      if (iVar8 != 0) {
        iVar9 = -0xb;
        goto LAB_004cccbc;
      }
      uStack_440 = 0x4cba4c;
      N_VScale(local_430->cv_h,local_430->cv_tempv,local_430->cv_zn[1]);
      goto LAB_004cba4c;
    }
    uStack_440 = 0x4cb8c9;
    cvAdjustOrder(pCVar21,-1);
    iVar8 = pCVar21->cv_q;
    pCVar21->cv_L = iVar8;
    pCVar21->cv_q = iVar8 + -1;
    pCVar21->cv_qwait = iVar8;
  }
  uStack_440 = 0x4cb8ec;
  cvRescale(pCVar21);
LAB_004cba4c:
  local_3a8 = (ulong)uVar12;
  goto LAB_004cadad;
LAB_004cbb0f:
  lVar14 = pCVar21->cv_nst;
  pCVar21->cv_nst = lVar14 + 1;
  pCVar21->cv_nscon = pCVar21->cv_nscon + 1;
  rVar28 = pCVar21->cv_h;
  pCVar21->cv_hu = rVar28;
  uVar12 = pCVar21->cv_q;
  pCVar21->cv_qu = uVar12;
  for (uVar15 = (ulong)uVar12; 1 < (int)uVar15; uVar15 = uVar15 - 1) {
    pCVar21->cv_tau[uVar15] = pCVar21->cv_tau[uVar15 - 1];
  }
  if (0 < lVar14 && uVar12 == 1) {
    pCVar21->cv_tau[2] = pCVar21->cv_tau[1];
  }
  pCVar21->cv_tau[1] = rVar28;
  uStack_440 = 0x4cbba8;
  N_VScaleAddMulti(uVar12 + 1,local_3a0,pCVar21->cv_acor,Y,Y);
  if (pCVar21->proj_applied != 0) {
    uStack_440 = 0x4cbbce;
    N_VScaleAddMulti(pCVar21->cv_q + 1,prVar22,pCVar21->cv_tempv,Y,Y);
  }
  iVar8 = pCVar21->cv_qwait + -1;
  pCVar21->cv_qwait = iVar8;
  if ((iVar8 == 1) && (pCVar21->cv_q != pCVar21->cv_qmax)) {
    uStack_440 = 0x4cbc09;
    N_VScale(1.0,pCVar21->cv_acor,pCVar21->cv_zn[pCVar21->cv_qmax]);
    pCVar21->cv_saved_tq5 = pCVar21->cv_tq[5];
    pCVar21->cv_indx_acor = pCVar21->cv_qmax;
  }
  if ((pCVar21->cv_etamax != 1.0) || (NAN(pCVar21->cv_etamax))) {
    uStack_440 = 0x4cbca3;
    rVar28 = SUNRpowerR(local_428 * 6.0,1.0 / (double)pCVar21->cv_L);
    dVar30 = 1.0 / (rVar28 + 1e-06);
    pCVar21->cv_etaq = dVar30;
    if (pCVar21->cv_qwait == 0) {
      pCVar21->cv_qwait = 2;
      pCVar21->cv_etaqm1 = 0.0;
      iVar8 = pCVar21->cv_q;
      rVar28 = 0.0;
      if (1 < (long)iVar8) {
        uStack_440 = 0x4cbd0d;
        rVar28 = N_VWrmsNorm(pCVar21->cv_zn[iVar8],pCVar21->cv_ewt);
        uStack_440 = 0x4cbd36;
        rVar28 = SUNRpowerR(rVar28 * pCVar21->cv_tq[1] * 6.0,1.0 / (double)pCVar21->cv_q);
        rVar28 = 1.0 / (rVar28 + 1e-06);
        iVar8 = pCVar21->cv_q;
      }
      dVar30 = 0.0;
      pCVar21->cv_etaqm1 = rVar28;
      pCVar21->cv_etaqp1 = 0.0;
      if (iVar8 != pCVar21->cv_qmax) {
        local_428 = pCVar21->cv_saved_tq5;
        if ((local_428 != 0.0) || (NAN(local_428))) {
          local_3e8 = pCVar21->cv_tq[5];
          uStack_3e0 = 0;
          uStack_440 = 0x4cbdb2;
          rVar28 = SUNRpowerI(pCVar21->cv_h / pCVar21->cv_tau[2],pCVar21->cv_L);
          uStack_440 = 0x4cbdf1;
          N_VLinearSum(rVar28 * (-local_3e8 / local_428),pCVar21->cv_zn[pCVar21->cv_qmax],1.0,
                       pCVar21->cv_acor,pCVar21->cv_tempv);
          uStack_440 = 0x4cbe04;
          rVar28 = N_VWrmsNorm(pCVar21->cv_tempv,pCVar21->cv_ewt);
          uStack_440 = 0x4cbe31;
          rVar28 = SUNRpowerR(rVar28 * pCVar21->cv_tq[3] * 10.0,1.0 / (double)(pCVar21->cv_L + 1));
          dVar30 = 1.0 / (rVar28 + 1e-06);
          rVar28 = pCVar21->cv_etaqm1;
        }
      }
      prVar16 = local_3d8;
      cvode_mem = local_430;
      pCVar21->cv_etaqp1 = dVar30;
      dVar33 = pCVar21->cv_etaq;
      dVar37 = dVar33;
      if (dVar33 <= dVar30) {
        dVar37 = dVar30;
      }
      dVar35 = rVar28;
      if (rVar28 <= dVar37) {
        dVar35 = dVar37;
      }
      if ((pCVar21->cv_eta_min_fx <= dVar35 && dVar35 != pCVar21->cv_eta_min_fx) &&
         (dVar35 < pCVar21->cv_eta_max_fx)) {
        pCVar21->cv_eta = 1.0;
        goto LAB_004cbeb0;
      }
      if ((dVar35 == dVar33) && (!NAN(dVar35) && !NAN(dVar33))) {
        pCVar21->cv_eta = dVar33;
        goto LAB_004cbeb0;
      }
      if ((dVar35 != rVar28) || (NAN(dVar35) || NAN(rVar28))) {
        local_430->cv_eta = dVar30;
        local_430->cv_qprime = local_430->cv_q + 1;
        if (local_430->cv_lmm == 2) {
          uStack_440 = 0x4cc365;
          N_VScale(1.0,local_430->cv_acor,local_430->cv_zn[local_430->cv_qmax]);
        }
      }
      else {
        local_430->cv_eta = rVar28;
        local_430->cv_qprime = local_430->cv_q + -1;
      }
    }
    else {
      pCVar21->cv_eta = dVar30;
LAB_004cbeb0:
      pCVar21->cv_qprime = pCVar21->cv_q;
      prVar16 = prVar22;
      cvode_mem = pCVar21;
    }
    uStack_440 = 0x4cbec4;
    cvSetEta((CVodeMem)cvode_mem);
  }
  else {
    iVar8 = pCVar21->cv_qwait;
    if (iVar8 < 3) {
      iVar8 = 2;
    }
    pCVar21->cv_qwait = iVar8;
    pCVar21->cv_qprime = pCVar21->cv_q;
    pCVar21->cv_hprime = pCVar21->cv_h;
    pCVar21->cv_eta = 1.0;
    prVar16 = prVar22;
  }
  if (((CVodeMem)cvode_mem)->cv_sldeton == 0) goto LAB_004cc6e8;
  iVar8 = ((CVodeMem)cvode_mem)->cv_q;
  if (2 < (long)iVar8) {
    prVar16 = local_358;
    for (lVar14 = 1; prVar22 = prVar16, uVar15 = 5, lVar14 != 4; lVar14 = lVar14 + 1) {
      for (; 1 < uVar15; uVar15 = uVar15 - 1) {
        *prVar22 = prVar22[-4];
        prVar22 = prVar22 + -4;
      }
      prVar16 = prVar16 + 1;
    }
    iVar7 = 1;
    for (iVar9 = 1; iVar8 != iVar9; iVar9 = iVar9 + 1) {
      iVar7 = iVar7 * iVar9;
    }
    local_428 = ((CVodeMem)cvode_mem)->cv_tq[5];
    if (local_428 <= 1e-10) {
      local_428 = 1e-10;
    }
    local_428 = ((double)((iVar8 + 1) * iVar7 * iVar8) * ((CVodeMem)cvode_mem)->cv_acnrm) /
                local_428;
    local_3c8 = (double)(iVar7 * iVar8);
    dStack_3c0 = 0.0;
    uStack_440 = 0x4cbf7a;
    local_3e8 = N_VWrmsNorm(((CVodeMem)cvode_mem)->cv_zn[iVar8],((CVodeMem)cvode_mem)->cv_ewt);
    dStack_3c0 = local_3c8;
    uStack_440 = 0x4cbfa8;
    uStack_3e0 = extraout_XMM0_Qb;
    local_3c8 = (double)iVar7;
    rVar28 = N_VWrmsNorm(((CVodeMem)cvode_mem)->cv_zn[(long)((CVodeMem)cvode_mem)->cv_q + -1],
                         ((CVodeMem)cvode_mem)->cv_ewt);
    ((CVodeMem)cvode_mem)->cv_ssdat[1][1] = rVar28 * local_3c8 * rVar28 * local_3c8;
    ((CVodeMem)cvode_mem)->cv_ssdat[1][2] = local_3e8 * dStack_3c0 * local_3e8 * dStack_3c0;
    ((CVodeMem)cvode_mem)->cv_ssdat[1][3] = local_428 * local_428;
    iVar8 = ((CVodeMem)cvode_mem)->cv_q;
    prVar16 = local_3d8;
  }
  if (((CVodeMem)cvode_mem)->cv_qprime < iVar8) {
    ((CVodeMem)cvode_mem)->cv_nscon = 0;
    goto LAB_004cc6e8;
  }
  if ((iVar8 < 3) || (((CVodeMem)cvode_mem)->cv_nscon < iVar8 + 5)) goto LAB_004cc6e8;
  pdVar17 = local_300;
  pdVar20 = &local_1e0;
  prVar22 = local_360;
  for (lVar14 = 1; prVar16 = local_3d8, lVar14 != 4; lVar14 = lVar14 + 1) {
    dVar30 = ((CVodeMem)cvode_mem)->cv_ssdat[1][lVar14];
    dVar33 = 0.0;
    dVar37 = dVar30;
    for (lVar25 = 0; lVar25 != 0xa0; lVar25 = lVar25 + 0x20) {
      dVar35 = *(double *)((long)prVar22 + lVar25);
      if (dVar35 <= dVar37) {
        dVar37 = dVar35;
      }
      if (dVar33 <= dVar35) {
        dVar33 = dVar35;
      }
    }
    if (dVar37 < dVar33 * 1e-10) goto LAB_004cc6e8;
    smax[lVar14] = dVar33;
    ssmax[lVar14] = dVar33 * dVar33;
    dVar33 = 0.0;
    dVar37 = 0.0;
    for (lVar25 = 0; lVar25 != 0x80; lVar25 = lVar25 + 0x20) {
      dVar35 = *(double *)((long)prVar22 + lVar25) / *(double *)((long)prVar22 + lVar25 + 0x20);
      dVar37 = dVar37 + dVar35;
      dVar33 = dVar33 + dVar35 * dVar35;
    }
    dVar37 = dVar37 * 0.25;
    rav[lVar14] = dVar37;
    vrat[lVar14] = ABS(dVar33 * 0.25 - dVar37 * dVar37);
    dVar33 = ((CVodeMem)cvode_mem)->cv_ssdat[2][lVar14];
    dVar37 = ((CVodeMem)cvode_mem)->cv_ssdat[3][lVar14];
    local_280[lVar14 + -1] = dVar30 * dVar37 - dVar33 * dVar33;
    dVar35 = ((CVodeMem)cvode_mem)->cv_ssdat[4][lVar14];
    local_2a0[lVar14 + -1] = dVar33 * dVar37 - dVar30 * dVar35;
    local_2c0[lVar14 + -1] = 0;
    dVar30 = ((CVodeMem)cvode_mem)->cv_ssdat[5][lVar14];
    local_2e0[lVar14 + -1] = dVar33 * dVar30 - dVar35 * dVar37;
    local_300[lVar14 + -1] = dVar35 * dVar35 - dVar30 * dVar37;
    for (lVar25 = 0; lVar25 != 0xa0; lVar25 = lVar25 + 0x20) {
      *(undefined8 *)((long)pdVar20 + lVar25) = *(undefined8 *)((long)pdVar17 + lVar25);
    }
    prVar22 = prVar22 + 1;
    pdVar20 = pdVar20 + 1;
    pdVar17 = pdVar17 + 1;
  }
  rVar28 = vrat[2];
  if (vrat[3] <= vrat[2]) {
    rVar28 = vrat[3];
  }
  rVar36 = vrat[1];
  if (rVar28 <= vrat[1]) {
    rVar36 = rVar28;
  }
  cvode_mem = local_430;
  if (1e-08 <= rVar36) {
    if (ABS(local_1e0) < ssmax[1] * 1e-10) goto LAB_004cc6e8;
    for (lVar14 = 0; lVar14 != 0x80; lVar14 = lVar14 + 0x20) {
      *(double *)((long)adStack_1c0 + lVar14 + 8) =
           *(double *)((long)adStack_1c0 + lVar14) * (-local_1d8 / local_1e0) +
           *(double *)((long)adStack_1c0 + lVar14 + 8);
    }
    local_1d8 = 0.0;
    for (lVar14 = 0; lVar14 != 0x80; lVar14 = lVar14 + 0x20) {
      *(double *)((long)adStack_1c0 + lVar14 + 0x10) =
           *(double *)((long)adStack_1c0 + lVar14) * (-local_1d0 / local_1e0) +
           *(double *)((long)adStack_1c0 + lVar14 + 0x10);
    }
    local_1d0 = 0.0;
    if (ABS(adStack_1c0[1]) < ssmax[2] * 1e-10) goto LAB_004cc6e8;
    for (lVar14 = 0; lVar14 != 0x60; lVar14 = lVar14 + 0x20) {
      *(double *)((long)adStack_1c0 + lVar14 + 0x30) =
           *(double *)((long)adStack_1c0 + lVar14 + 0x28) * (-adStack_1c0[2] / adStack_1c0[1]) +
           *(double *)((long)adStack_1c0 + lVar14 + 0x30);
    }
    if (((ABS(adStack_1c0[10]) < ssmax[3] * 1e-10) ||
        (rVar28 = -adStack_1c0[0xe] / adStack_1c0[10], rVar28 < 1e-10)) || (100.0 < rVar28))
    goto LAB_004cc6e8;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      qkr[lVar14 + 1] =
           ((local_300[lVar14] * rVar28 + local_2e0[lVar14]) * rVar28 * rVar28 + local_2a0[lVar14])
           * rVar28 + local_280[lVar14];
    }
    dVar30 = 0.0;
    for (lVar14 = 1; lVar14 != 4; lVar14 = lVar14 + 1) {
      dVar33 = ABS(qkr[lVar14]) / ssmax[lVar14];
      if (ABS(qkr[lVar14]) / ssmax[lVar14] <= dVar30) {
        dVar33 = dVar30;
      }
      dVar30 = dVar33;
    }
    if (0.001 <= dVar30) {
      iVar9 = 0;
      uVar15 = 0;
      for (iVar7 = 1; iVar7 != 4; iVar7 = iVar7 + 1) {
        for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
          dVar30 = (local_2e0[lVar14] * 3.0 + local_300[lVar14] * rVar28 * 4.0) * rVar28 * rVar28 +
                   local_2a0[lVar14];
          dVar33 = 0.0;
          if (ssmax[lVar14 + 1] * 1e-10 < ABS(dVar30)) {
            dVar33 = -qkr[lVar14 + 1] / dVar30;
          }
          rrc[lVar14 + 1] = dVar33 + rVar28;
        }
        prVar22 = qjk[1];
        for (lVar14 = 1; prVar22 = prVar22 + 1, lVar14 != 4; lVar14 = lVar14 + 1) {
          dVar30 = rrc[lVar14];
          dVar33 = 0.0;
          for (lVar25 = 0; lVar25 != 0x18; lVar25 = lVar25 + 8) {
            dVar37 = ((*(double *)((long)local_300 + lVar25) * dVar30 +
                      *(double *)((long)local_2e0 + lVar25)) * dVar30 * dVar30 +
                     *(double *)((long)local_2a0 + lVar25)) * dVar30 +
                     *(double *)((long)local_280 + lVar25);
            *(double *)((long)prVar22 + lVar25 * 4) = dVar37;
            dVar37 = ABS(dVar37) / *(double *)((long)ssmax + lVar25 + 8);
            if (dVar37 <= dVar33) {
              dVar37 = dVar33;
            }
            dVar33 = dVar37;
          }
          sqmx[lVar14] = dVar33;
        }
        dVar30 = sqmx[1] + 1.0;
        for (uVar10 = 1; uVar10 != 4; uVar10 = uVar10 + 1) {
          if (sqmx[uVar10] < dVar30) {
            uVar15 = uVar10 & 0xffffffff;
            dVar30 = sqmx[uVar10];
          }
        }
        rVar28 = rrc[(int)uVar15];
        if (dVar30 < 0.001) {
          iVar9 = 3;
          break;
        }
        for (lVar14 = 8; lVar14 != 0x20; lVar14 = lVar14 + 8) {
          *(undefined8 *)((long)qkr + lVar14) =
               *(undefined8 *)((long)qjk[0] + lVar14 * 4 + (long)(int)uVar15 * 8);
        }
      }
      bVar27 = dVar30 == 0.001;
      bVar26 = dVar30 < 0.001;
      goto LAB_004cc375;
    }
    iVar9 = 2;
  }
  else {
    dVar30 = vrat[2];
    if (vrat[2] <= vrat[3]) {
      dVar30 = vrat[3];
    }
    rVar28 = vrat[1];
    if (vrat[1] <= dVar30) {
      rVar28 = dVar30;
    }
    if (2.5e-07 < rVar28) goto LAB_004cc6e8;
    rVar28 = (rav[1] + rav[2] + rav[3]) / 3.0;
    dVar30 = 0.0;
    for (lVar14 = 1; lVar14 != 4; lVar14 = lVar14 + 1) {
      if (dVar30 <= ABS(rav[lVar14] - rVar28)) {
        dVar30 = ABS(rav[lVar14] - rVar28);
      }
    }
    bVar27 = dVar30 == 0.0005;
    bVar26 = dVar30 < 0.0005;
    iVar9 = 1;
LAB_004cc375:
    if (!bVar26 && !bVar27) goto LAB_004cc6e8;
  }
  for (lVar14 = 0xa5; lVar14 != 0xa8; lVar14 = lVar14 + 1) {
    dVar30 = *(double *)((long)local_430 + lVar14 * 8 + -0x40) * rVar28;
    dVar37 = rVar28 * (double)local_430->cv_zn[lVar14 + -0x10] * rVar28;
    dVar33 = dVar30 - dVar37;
    if (ABS(dVar33) < adStack_5f8[lVar14] * 1e-10) goto LAB_004cc6e8;
    dVar37 = dVar33 - (dVar37 - (double)local_430->cv_zn[lVar14 + -0xc] * rVar28 * rVar28 * rVar28);
    dVar33 = -(((*(double *)((long)local_430 + lVar14 * 8 + -0x60) - dVar30) - dVar33) - dVar37) /
             dVar33;
    if ((dVar33 < 1e-10) || (4.0 < dVar33)) goto LAB_004cc6e8;
    adStack_768[lVar14] =
         (double)local_430->cv_zn[lVar14 + -0x10] + (dVar37 / dVar33) / (rVar28 * rVar28);
  }
  if (1e-10 <= sigsq[2]) {
    dVar30 = ((double)(iVar8 * iVar8 + -1) * -0.25 * (sigsq[3] / sigsq[2]) +
             (sigsq[1] / sigsq[2]) * (sigsq[3] / sigsq[2]) + -1.0) * (-2.0 / (double)(iVar8 + -1)) +
             1.0;
    if (((1e-10 <= ABS(dVar30)) && (ABS(1.0 / dVar30 - rVar28) <= 0.01)) && (0.98 < rVar28)) {
      iVar7 = iVar9;
      if (iVar9 == 1) {
        iVar7 = 4;
      }
      if ((iVar7 == 3) || (iVar9 == 1 || iVar7 == 2)) {
        local_430->cv_qprime = iVar8 + -1;
        dVar30 = local_430->cv_etaqm1;
        if (local_430->cv_etamax <= local_430->cv_etaqm1) {
          dVar30 = local_430->cv_etamax;
        }
        dVar37 = ABS(local_430->cv_h) * local_430->cv_hmax_inv * dVar30;
        dVar33 = 1.0;
        if (1.0 <= dVar37) {
          dVar33 = dVar37;
        }
        local_430->cv_eta = dVar30 / dVar33;
        local_430->cv_hprime = (dVar30 / dVar33) * local_430->cv_h;
        local_430->cv_nor = local_430->cv_nor + 1;
      }
    }
  }
LAB_004cc6e8:
  ((CVodeMem)cvode_mem)->cv_etamax =
       (&((CVodeMem)cvode_mem)->cv_eta_max_es)
       [((CVodeMem)cvode_mem)->cv_small_nst < ((CVodeMem)cvode_mem)->cv_nst];
  uStack_440 = 0x4cc723;
  N_VScale(((CVodeMem)cvode_mem)->cv_tq[2],((CVodeMem)cvode_mem)->cv_acor,
           ((CVodeMem)cvode_mem)->cv_acor);
  if ((((CVodeMem)cvode_mem)->cv_tstopset != 0) &&
     (ABS(((CVodeMem)cvode_mem)->cv_tn - ((CVodeMem)cvode_mem)->cv_tstop) <=
      (ABS(((CVodeMem)cvode_mem)->cv_h) + ABS(((CVodeMem)cvode_mem)->cv_tn)) *
      ((CVodeMem)cvode_mem)->cv_uround * 100.0)) {
    ((CVodeMem)cvode_mem)->cv_tn = ((CVodeMem)cvode_mem)->cv_tstop;
  }
  if (0 < ((CVodeMem)cvode_mem)->cv_nrtfn) {
    uStack_440 = 0x4cc7a0;
    iVar8 = cvRcheck3((CVodeMem)cvode_mem);
    if (iVar8 == -0xc) {
      pcVar13 = "cvRcheck3";
      pcVar24 = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
      iVar8 = -0xc;
      goto LAB_004caa59;
    }
    if (iVar8 == 1) {
      ((CVodeMem)cvode_mem)->cv_irfnd = 1;
      rVar28 = ((CVodeMem)cvode_mem)->cv_tlo;
      *local_3f8 = rVar28;
      ((CVodeMem)cvode_mem)->cv_tretlast = rVar28;
      return 2;
    }
    if (((CVodeMem)cvode_mem)->cv_nst == 1) {
      uVar15 = (ulong)(uint)((CVodeMem)cvode_mem)->cv_nrtfn;
      if (((CVodeMem)cvode_mem)->cv_nrtfn < 1) {
        uVar15 = 0;
      }
      uVar10 = 0;
      do {
        if (uVar15 == uVar10) goto LAB_004cc81b;
        piVar1 = ((CVodeMem)cvode_mem)->cv_gactive + uVar10;
        uVar10 = uVar10 + 1;
      } while (*piVar1 != 0);
      if (0 < ((CVodeMem)cvode_mem)->cv_mxgnull) {
        uStack_440 = 0x4cc813;
        cvProcessError((CVodeMem)cvode_mem,99,"CVODE","CVode",
                       "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                      );
      }
    }
  }
LAB_004cc81b:
  if (((int)local_3b0 == 1) &&
     (0.0 <= (((CVodeMem)cvode_mem)->cv_tn - local_408) * ((CVodeMem)cvode_mem)->cv_h)) {
    *local_3f8 = local_408;
    ((CVodeMem)cvode_mem)->cv_tretlast = local_408;
    uStack_440 = 0x4cd0c1;
    CVodeGetDky(cvode_mem,local_408,0,local_3f0);
    ((CVodeMem)cvode_mem)->cv_next_q = ((CVodeMem)cvode_mem)->cv_qprime;
    ((CVodeMem)cvode_mem)->cv_next_h = ((CVodeMem)cvode_mem)->cv_hprime;
    return 0;
  }
  if (((CVodeMem)cvode_mem)->cv_tstopset != 0) {
    dVar30 = ((CVodeMem)cvode_mem)->cv_tstop;
    dVar33 = ((CVodeMem)cvode_mem)->cv_tn;
    dVar37 = ((CVodeMem)cvode_mem)->cv_h;
    if (ABS(dVar33 - dVar30) <=
        (ABS(dVar37) + ABS(dVar33)) * ((CVodeMem)cvode_mem)->cv_uround * 100.0) {
      uStack_440 = 0x4cd082;
      CVodeGetDky(cvode_mem,dVar30,0,local_3f0);
      rVar28 = ((CVodeMem)cvode_mem)->cv_tstop;
      *local_3f8 = rVar28;
      goto LAB_004ccc3a;
    }
    if (0.0 < ((((CVodeMem)cvode_mem)->cv_hprime + dVar33) - dVar30) * dVar37) {
      dVar30 = (((CVodeMem)cvode_mem)->cv_uround * -4.0 + 1.0) * (dVar30 - dVar33);
      ((CVodeMem)cvode_mem)->cv_hprime = dVar30;
      ((CVodeMem)cvode_mem)->cv_eta = dVar30 / dVar37;
    }
  }
  local_380 = local_380 + 1;
  if ((int)local_3b0 == 2) {
    rVar28 = ((CVodeMem)cvode_mem)->cv_tn;
    *local_3f8 = rVar28;
    ((CVodeMem)cvode_mem)->cv_tretlast = rVar28;
    uStack_440 = 0x4cd006;
    N_VScale(1.0,((CVodeMem)cvode_mem)->cv_zn[0],local_3f0);
    ((CVodeMem)cvode_mem)->cv_next_q = ((CVodeMem)cvode_mem)->cv_qprime;
    ((CVodeMem)cvode_mem)->cv_next_h = ((CVodeMem)cvode_mem)->cv_hprime;
    return 0;
  }
  goto LAB_004cabae;
}

Assistant:

int CVode(void *cvode_mem, realtype tout, N_Vector yout,
          realtype *tret, int itask)
{
  CVodeMem cv_mem;
  long int nstloc;
  int retval, hflag, kflag, istate, ir, ier, irfndp;
  int ewtsetOK;
  realtype troundoff, tout_hin, rh, nrm;
  booleantype inactive_roots;

  /*
   * -------------------------------------
   * 1. Check and process inputs
   * -------------------------------------
   */

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVode", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Check if cvode_mem was allocated */
  if (cv_mem->cv_MallocDone == SUNFALSE) {
    cvProcessError(cv_mem, CV_NO_MALLOC, "CVODE", "CVode", MSGCV_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_NO_MALLOC);
  }

  /* Check for yout != NULL */
  if ((cv_mem->cv_y = yout) == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_YOUT_NULL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  /* Check for tret != NULL */
  if (tret == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_TRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  /* Check for valid itask */
  if ( (itask != CV_NORMAL) && (itask != CV_ONE_STEP) ) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_BAD_ITASK);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  if (itask == CV_NORMAL) cv_mem->cv_toutc = tout;
  cv_mem->cv_taskc = itask;

  /*
   * ----------------------------------------
   * 2. Initializations performed only at
   *    the first step (nst=0):
   *    - initial setup
   *    - initialize Nordsieck history array
   *    - compute initial step size
   *    - check for approach to tstop
   *    - check for approach to a root
   * ----------------------------------------
   */

  if (cv_mem->cv_nst == 0) {

    cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;

    /* Check inputs for corectness */

    ier = cvInitialSetup(cv_mem);
    if (ier != CV_SUCCESS) {
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(ier);
    }

    /* Call f at (t0,y0), set zn[1] = y'(t0). */

    retval = cv_mem->cv_f(cv_mem->cv_tn, cv_mem->cv_zn[0],
                          cv_mem->cv_zn[1], cv_mem->cv_user_data);
    cv_mem->cv_nfe++;
    if (retval < 0) {
      cvProcessError(cv_mem, CV_RHSFUNC_FAIL, "CVODE", "CVode",
                     MSGCV_RHSFUNC_FAILED, cv_mem->cv_tn);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_RHSFUNC_FAIL);
    }
    if (retval > 0) {
      cvProcessError(cv_mem, CV_FIRST_RHSFUNC_ERR, "CVODE", "CVode",
                     MSGCV_RHSFUNC_FIRST);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_FIRST_RHSFUNC_ERR);
    }

    /* Test input tstop for legality. */

    if (cv_mem->cv_tstopset) {
      if ( (cv_mem->cv_tstop - cv_mem->cv_tn)*(tout - cv_mem->cv_tn) <= ZERO ) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                       MSGCV_BAD_TSTOP, cv_mem->cv_tstop, cv_mem->cv_tn);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      }
    }

    /* Set initial h (from H0 or cvHin). */

    cv_mem->cv_h = cv_mem->cv_hin;
    if ( (cv_mem->cv_h != ZERO) && ((tout-cv_mem->cv_tn)*cv_mem->cv_h < ZERO) ) {
      cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_BAD_H0);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_ILL_INPUT);
    }
    if (cv_mem->cv_h == ZERO) {
      tout_hin = tout;
      if ( cv_mem->cv_tstopset &&
           (tout-cv_mem->cv_tn)*(tout-cv_mem->cv_tstop) > ZERO )
        tout_hin = cv_mem->cv_tstop;
      hflag = cvHin(cv_mem, tout_hin);
      if (hflag != CV_SUCCESS) {
        istate = cvHandleFailure(cv_mem, hflag);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(istate);
      }
    }

    /* Enforce hmax and hmin */

    rh = SUNRabs(cv_mem->cv_h)*cv_mem->cv_hmax_inv;
    if (rh > ONE) cv_mem->cv_h /= rh;
    if (SUNRabs(cv_mem->cv_h) < cv_mem->cv_hmin)
      cv_mem->cv_h *= cv_mem->cv_hmin/SUNRabs(cv_mem->cv_h);

    /* Check for approach to tstop */

    if (cv_mem->cv_tstopset) {
      if ( (cv_mem->cv_tn + cv_mem->cv_h - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO )
        cv_mem->cv_h = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
    }

    /* Scale zn[1] by h.*/

    cv_mem->cv_hscale = cv_mem->cv_h;
    cv_mem->cv_h0u    = cv_mem->cv_h;
    cv_mem->cv_hprime = cv_mem->cv_h;

    N_VScale(cv_mem->cv_h, cv_mem->cv_zn[1], cv_mem->cv_zn[1]);

    /* Check for zeros of root function g at and near t0. */

    if (cv_mem->cv_nrtfn > 0) {

      retval = cvRcheck1(cv_mem);

      if (retval == CV_RTFUNC_FAIL) {
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck1",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tn);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_RTFUNC_FAIL);
      }

    }

  } /* end of first call block */

  /*
   * ------------------------------------------------------
   * 3. At following steps, perform stop tests:
   *    - check for root in last step
   *    - check if we passed tstop
   *    - check if we passed tout (NORMAL mode)
   *    - check if current tn was returned (ONE_STEP mode)
   *    - check if we are close to tstop
   *      (adjust step size if needed)
   * -------------------------------------------------------
   */

  if (cv_mem->cv_nst > 0) {

    /* Estimate an infinitesimal time interval to be used as
       a roundoff for time quantities (based on current time
       and step size) */
    troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
      (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));

    /* First, check for a root in the last step taken, other than the
       last root found, if any.  If itask = CV_ONE_STEP and y(tn) was not
       returned because of an intervening root, return y(tn) now.     */
    if (cv_mem->cv_nrtfn > 0) {

      irfndp = cv_mem->cv_irfnd;

      retval = cvRcheck2(cv_mem);

      if (retval == CLOSERT) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "cvRcheck2",
                       MSGCV_CLOSE_ROOTS, cv_mem->cv_tlo);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      } else if (retval == CV_RTFUNC_FAIL) {
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck2",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_RTFUNC_FAIL);
      } else if (retval == RTFOUND) {
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ROOT_RETURN);
      }

      /* If tn is distinct from tretlast (within roundoff),
         check remaining interval for roots */
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tretlast) > troundoff ) {

        retval = cvRcheck3(cv_mem);

        if (retval == CV_SUCCESS) {     /* no root found */
          cv_mem->cv_irfnd = 0;
          if ((irfndp == 1) && (itask == CV_ONE_STEP)) {
            cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
            N_VScale(ONE, cv_mem->cv_zn[0], yout);
            SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
            return(CV_SUCCESS);
          }
        } else if (retval == RTFOUND) {  /* a new root was found */
          cv_mem->cv_irfnd = 1;
          cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_ROOT_RETURN);
        } else if (retval == CV_RTFUNC_FAIL) {  /* g failed */
          cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck3",
                         MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_RTFUNC_FAIL);
        }

      }

    } /* end of root stop check */

    /* In CV_NORMAL mode, test if tout was reached */
    if ( (itask == CV_NORMAL) && ((cv_mem->cv_tn-tout)*cv_mem->cv_h >= ZERO) ) {
      cv_mem->cv_tretlast = *tret = tout;
      ier =  CVodeGetDky(cv_mem, tout, 0, yout);
      if (ier != CV_SUCCESS) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                       MSGCV_BAD_TOUT, tout);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      }
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_SUCCESS);
    }

    /* In CV_ONE_STEP mode, test if tn was returned */
    if ( itask == CV_ONE_STEP &&
         SUNRabs(cv_mem->cv_tn - cv_mem->cv_tretlast) > troundoff ) {
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_SUCCESS);
    }

    /* Test for tn at tstop or near tstop */
    if ( cv_mem->cv_tstopset ) {

      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff ) {
        ier =  CVodeGetDky(cv_mem, cv_mem->cv_tstop, 0, yout);
        if (ier != CV_SUCCESS) {
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_BAD_TSTOP, cv_mem->cv_tstop, cv_mem->cv_tn);
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_ILL_INPUT);
        }
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tstop;
        cv_mem->cv_tstopset = SUNFALSE;
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_TSTOP_RETURN);
      }

      /* If next step would overtake tstop, adjust stepsize */
      if ( (cv_mem->cv_tn + cv_mem->cv_hprime - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO ) {
        cv_mem->cv_hprime = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
        cv_mem->cv_eta = cv_mem->cv_hprime / cv_mem->cv_h;
      }

    }

  } /* end stopping tests block */

  /*
   * --------------------------------------------------
   * 4. Looping point for internal steps
   *
   *    4.1. check for errors (too many steps, too much
   *         accuracy requested, step size too small)
   *    4.2. take a new step (call cvStep)
   *    4.3. stop on error
   *    4.4. perform stop tests:
   *         - check for root in last step
   *         - check if tout was passed
   *         - check if close to tstop
   *         - check if in ONE_STEP mode (must return)
   * --------------------------------------------------
   */

  nstloc = 0;
  for(;;) {

    cv_mem->cv_next_h = cv_mem->cv_h;
    cv_mem->cv_next_q = cv_mem->cv_q;

    /* Reset and check ewt */
    if (cv_mem->cv_nst > 0) {

      ewtsetOK = cv_mem->cv_efun(cv_mem->cv_zn[0], cv_mem->cv_ewt, cv_mem->cv_e_data);

      if (ewtsetOK != 0) {

        if (cv_mem->cv_itol == CV_WF)
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_EWT_NOW_FAIL, cv_mem->cv_tn);
        else
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_EWT_NOW_BAD, cv_mem->cv_tn);

        istate = CV_ILL_INPUT;
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
        N_VScale(ONE, cv_mem->cv_zn[0], yout);
        break;
      }
    }

    /* Check for too many steps */
    if ( (cv_mem->cv_mxstep>0) && (nstloc >= cv_mem->cv_mxstep) ) {
      cvProcessError(cv_mem, CV_TOO_MUCH_WORK, "CVODE", "CVode",
                     MSGCV_MAX_STEPS, cv_mem->cv_tn);
      istate = CV_TOO_MUCH_WORK;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      break;
    }

    /* Check for too much accuracy requested */
    nrm = N_VWrmsNorm(cv_mem->cv_zn[0], cv_mem->cv_ewt);
    cv_mem->cv_tolsf = cv_mem->cv_uround * nrm;
    if (cv_mem->cv_tolsf > ONE) {
      cvProcessError(cv_mem, CV_TOO_MUCH_ACC, "CVODE", "CVode",
                     MSGCV_TOO_MUCH_ACC, cv_mem->cv_tn);
      istate = CV_TOO_MUCH_ACC;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      cv_mem->cv_tolsf *= TWO;
      break;
    } else {
      cv_mem->cv_tolsf = ONE;
    }

    /* Check for h below roundoff level in tn */
    if (cv_mem->cv_tn + cv_mem->cv_h == cv_mem->cv_tn) {
      cv_mem->cv_nhnil++;
      if (cv_mem->cv_nhnil <= cv_mem->cv_mxhnil)
        cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode", MSGCV_HNIL,
                       cv_mem->cv_tn, cv_mem->cv_h);
      if (cv_mem->cv_nhnil == cv_mem->cv_mxhnil)
        cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode", MSGCV_HNIL_DONE);
    }

    /* Call cvStep to take a step */
    kflag = cvStep(cv_mem);

    /* Process failed step cases, and exit loop */
    if (kflag != CV_SUCCESS) {
      istate = cvHandleFailure(cv_mem, kflag);
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      break;
    }

    nstloc++;

    /* If tstop is set and was reached, reset tn = tstop */
    if ( cv_mem->cv_tstopset ) {
      troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
        (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff)
        cv_mem->cv_tn = cv_mem->cv_tstop;
    }

    /* Check for root in last step taken. */
    if (cv_mem->cv_nrtfn > 0) {

      retval = cvRcheck3(cv_mem);

      if (retval == RTFOUND) {  /* A new root was found */
        cv_mem->cv_irfnd = 1;
        istate = CV_ROOT_RETURN;
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
        break;
      } else if (retval == CV_RTFUNC_FAIL) { /* g failed */
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck3",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
        istate = CV_RTFUNC_FAIL;
        break;
      }

      /* If we are at the end of the first step and we still have
       * some event functions that are inactive, issue a warning
       * as this may indicate a user error in the implementation
       * of the root function. */

      if (cv_mem->cv_nst==1) {
        inactive_roots = SUNFALSE;
        for (ir=0; ir<cv_mem->cv_nrtfn; ir++) {
          if (!cv_mem->cv_gactive[ir]) {
            inactive_roots = SUNTRUE;
            break;
          }
        }
        if ((cv_mem->cv_mxgnull > 0) && inactive_roots) {
          cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode",
                         MSGCV_INACTIVE_ROOTS);
        }
      }

    }

    /* In NORMAL mode, check if tout reached */
    if ( (itask == CV_NORMAL) &&  (cv_mem->cv_tn-tout)*cv_mem->cv_h >= ZERO ) {
      istate = CV_SUCCESS;
      cv_mem->cv_tretlast = *tret = tout;
      (void) CVodeGetDky(cv_mem, tout, 0, yout);
      cv_mem->cv_next_q = cv_mem->cv_qprime;
      cv_mem->cv_next_h = cv_mem->cv_hprime;
      break;
    }

    /* Check if tn is at tstop or near tstop */
    if ( cv_mem->cv_tstopset ) {

      troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
        (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff) {
        (void) CVodeGetDky(cv_mem, cv_mem->cv_tstop, 0, yout);
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tstop;
        cv_mem->cv_tstopset = SUNFALSE;
        istate = CV_TSTOP_RETURN;
        break;
      }

      if ( (cv_mem->cv_tn + cv_mem->cv_hprime - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO ) {
        cv_mem->cv_hprime = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
        cv_mem->cv_eta = cv_mem->cv_hprime / cv_mem->cv_h;
      }

    }

    /* In ONE_STEP mode, copy y and exit loop */
    if (itask == CV_ONE_STEP) {
      istate = CV_SUCCESS;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      cv_mem->cv_next_q = cv_mem->cv_qprime;
      cv_mem->cv_next_h = cv_mem->cv_hprime;
      break;
    }

  } /* end looping for internal steps */


  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return(istate);
}